

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSplit.c
# Opt level: O3

DdNode * cuddSplitSetRecur(DdManager *manager,st__table *mtable,int *varSeen,DdNode *p,double n,
                          double max,int index)

{
  int index_00;
  int iVar1;
  int *piVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  byte bVar7;
  ulong uVar8;
  double *dummy;
  double local_58;
  double local_50;
  double *local_40;
  double local_38;
  
  piVar2 = (int *)((ulong)p & 0xfffffffffffffffe);
  index_00 = *piVar2;
  if ((long)index_00 == 0x7fffffff) {
    pDVar3 = selectMintermsFromUniverse(manager,varSeen,n);
    return pDVar3;
  }
  pDVar3 = manager->one;
  varSeen[manager->invperm[index_00]] = -1;
  pDVar6 = (DdNode *)((ulong)*(DdNode **)(piVar2 + 4) ^ 1);
  pDVar4 = (DdNode *)((ulong)*(DdNode **)(piVar2 + 6) ^ 1);
  if (((ulong)p & 1) == 0) {
    pDVar6 = *(DdNode **)(piVar2 + 4);
    pDVar4 = *(DdNode **)(piVar2 + 6);
  }
  bVar7 = (byte)index;
  if (*(int *)((ulong)pDVar6 & 0xfffffffffffffffe) == 0x7fffffff) {
    if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) == 0x7fffffff) {
      pDVar3 = selectMintermsFromUniverse(manager,varSeen,n);
      if (pDVar3 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      piVar2 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + 1;
      pDVar4 = cuddBddAndRecur(manager,p,pDVar3);
      if (pDVar4 != (DdNode *)0x0) {
        uVar8 = (ulong)pDVar4 & 0xfffffffffffffffe;
        *(int *)(uVar8 + 4) = *(int *)(uVar8 + 4) + 1;
        goto LAB_007e8bdf;
      }
      goto LAB_007e8e30;
    }
    if (pDVar6 == pDVar3) {
      local_58 = max / (double)(2 << (bVar7 & 0x1f));
      local_38 = n;
      goto LAB_007e8c81;
    }
    local_58 = 0.0;
    local_38 = n;
LAB_007e8ca9:
    iVar1 = st__lookup(mtable,(char *)pDVar4,(char **)&local_40);
    if (iVar1 == 0) {
      return (DdNode *)0x0;
    }
    local_50 = *local_40 / (double)(2 << (bVar7 & 0x1f));
  }
  else {
    local_38 = n;
    iVar1 = st__lookup(mtable,(char *)pDVar6,(char **)&local_40);
    if (iVar1 == 0) {
      return (DdNode *)0x0;
    }
    local_58 = *local_40 / (double)(2 << (bVar7 & 0x1f));
LAB_007e8c81:
    if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) != 0x7fffffff) goto LAB_007e8ca9;
    if (pDVar4 == pDVar3) {
      local_50 = max / (double)(2 << (bVar7 & 0x1f));
    }
    else {
      local_50 = 0.0;
    }
  }
  pDVar3 = cuddUniqueInter(manager,index_00,pDVar3,(DdNode *)((ulong)pDVar3 ^ 1));
  piVar2 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
  *piVar2 = *piVar2 + 1;
  if ((local_58 != local_38) || (pDVar5 = pDVar3, NAN(local_58) || NAN(local_38))) {
    if ((local_50 != local_38) || (NAN(local_50) || NAN(local_38))) {
      if (local_58 < local_38) {
        pDVar5 = cuddSplitSetRecur(manager,mtable,varSeen,pDVar4,local_38 - local_58,max,index + 1);
        if (pDVar5 == (DdNode *)0x0) goto LAB_007e8e30;
        piVar2 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar2 = *piVar2 + 1;
        pDVar4 = cuddBddIteRecur(manager,pDVar3,pDVar6,pDVar5);
      }
      else {
        if (local_50 < local_38) {
          pDVar6 = cuddSplitSetRecur(manager,mtable,varSeen,pDVar6,local_38 - local_50,max,index + 1
                                    );
          if (pDVar6 != (DdNode *)0x0) {
            piVar2 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar2 = *piVar2 + 1;
            pDVar4 = cuddBddIteRecur(manager,pDVar3,pDVar6,pDVar4);
            if (pDVar4 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(manager,pDVar6);
              goto LAB_007e8e30;
            }
            uVar8 = (ulong)pDVar4 & 0xfffffffffffffffe;
            *(int *)(uVar8 + 4) = *(int *)(uVar8 + 4) + 1;
            Cudd_RecursiveDeref(manager,pDVar6);
            goto LAB_007e8bdf;
          }
          goto LAB_007e8e30;
        }
        if (*(int *)((ulong)pDVar6 & 0xfffffffffffffffe) == 0x7fffffff) {
          if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) != 0x7fffffff) {
            pDVar5 = selectMintermsFromUniverse(manager,varSeen,local_38);
            if (pDVar5 == (DdNode *)0x0) goto LAB_007e8e30;
            piVar2 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
            *piVar2 = *piVar2 + 1;
            pDVar4 = pDVar3;
LAB_007e8f58:
            pDVar4 = cuddBddAndRecur(manager,pDVar4,pDVar5);
            goto joined_r0x007e8df8;
          }
        }
        else if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) == 0x7fffffff) {
          pDVar5 = selectMintermsFromUniverse(manager,varSeen,local_38);
          if (pDVar5 == (DdNode *)0x0) goto LAB_007e8e30;
          piVar2 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + 1;
          pDVar4 = (DdNode *)((ulong)pDVar3 ^ 1);
          goto LAB_007e8f58;
        }
        if (local_58 < local_50) {
          pDVar5 = cuddSplitSetRecur(manager,mtable,varSeen,pDVar6,local_38,max,index + 1);
          if (pDVar5 == (DdNode *)0x0) goto LAB_007e8e30;
          piVar2 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + 1;
          pDVar4 = pDVar3;
        }
        else {
          pDVar5 = cuddSplitSetRecur(manager,mtable,varSeen,pDVar4,local_38,max,index + 1);
          if (pDVar5 == (DdNode *)0x0) goto LAB_007e8e30;
          piVar2 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar2 = *piVar2 + 1;
          pDVar4 = (DdNode *)((ulong)pDVar3 ^ 1);
        }
        pDVar4 = cuddBddAndRecur(manager,pDVar4,pDVar5);
      }
joined_r0x007e8df8:
      if (pDVar4 != (DdNode *)0x0) {
        uVar8 = (ulong)pDVar4 & 0xfffffffffffffffe;
        *(int *)(uVar8 + 4) = *(int *)(uVar8 + 4) + 1;
        Cudd_RecursiveDeref(manager,pDVar5);
LAB_007e8bdf:
        Cudd_RecursiveDeref(manager,pDVar3);
        *(int *)(uVar8 + 4) = *(int *)(uVar8 + 4) + -1;
        return pDVar4;
      }
      Cudd_RecursiveDeref(manager,pDVar5);
      goto LAB_007e8e30;
    }
    pDVar6 = pDVar4;
    pDVar5 = (DdNode *)((ulong)pDVar3 ^ 1);
  }
  pDVar4 = cuddBddAndRecur(manager,pDVar5,pDVar6);
  if (pDVar4 != (DdNode *)0x0) {
    piVar2 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar2 = *piVar2 + 1;
    Cudd_RecursiveDeref(manager,pDVar3);
    piVar2 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar2 = *piVar2 + -1;
    return pDVar4;
  }
LAB_007e8e30:
  Cudd_RecursiveDeref(manager,pDVar3);
  return (DdNode *)0x0;
}

Assistant:

DdNode*
cuddSplitSetRecur(
  DdManager * manager,
  st__table * mtable,
  int * varSeen,
  DdNode * p,
  double  n,
  double  max,
  int  index)
{
    DdNode *one, *zero, *N, *Nv;
    DdNode *Nnv, *q, *r, *v;
    DdNode *result;
    double *dummy, numT, numE;
    int variable, positive;
  
    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* If p is constant, extract n minterms from constant 1.  The procedure by
    ** construction guarantees that minterms will not be extracted from
    ** constant 0.
    */
    if (Cudd_IsConstant(p)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        return(q);
    }

    N = Cudd_Regular(p);

    /* Set variable as seen. */
    variable = N->index;
    varSeen[manager->invperm[variable]] = -1;

    Nv = cuddT(N);
    Nnv = cuddE(N);
    if (Cudd_IsComplement(p)) {
        Nv = Cudd_Not(Nv);
        Nnv = Cudd_Not(Nnv);
    }

    /* If both the children of 'p' are constants, extract n minterms from a
    ** constant node.
    */
    if (Cudd_IsConstant(Nv) && Cudd_IsConstant(Nnv)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        if (q == NULL) {
            return(NULL);
        }
        cuddRef(q);
        r = cuddBddAndRecur(manager,p,q);
        if (r == NULL) {
            Cudd_RecursiveDeref(manager,q);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDeref(manager,q);
        cuddDeref(r);
        return(r);
    }
  
    /* Lookup the # of minterms in the onset of the node from the table. */
    if (!Cudd_IsConstant(Nv)) {
        if (! st__lookup(mtable, (const char *)Nv, (char **)&dummy)) return(NULL);
        numT = *dummy/(2*(1<<index));
    } else if (Nv == one) {
        numT = max/(2*(1<<index));
    } else {
        numT = 0;
    }
  
    if (!Cudd_IsConstant(Nnv)) {
        if (! st__lookup(mtable, (const char *)Nnv, (char **)&dummy)) return(NULL);
        numE = *dummy/(2*(1<<index));
    } else if (Nnv == one) {
        numE = max/(2*(1<<index));
    } else {
        numE = 0;
    }

    v = cuddUniqueInter(manager,variable,one,zero);
    cuddRef(v);

    /* If perfect match. */
    if (numT == n) {
        q = cuddBddAndRecur(manager,v,Nv);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(q);
        return(q);
    }
    if (numE == n) {
        q = cuddBddAndRecur(manager,Cudd_Not(v),Nnv);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(q);
        return(q);
    }
    /* If n is greater than numT, extract the difference from the ELSE child
    ** and retain the function represented by the THEN branch.
    */
    if (numT < n) {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nnv,(n-numT),max,index+1);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        r = cuddBddIteRecur(manager,v,Nv,q);
        if (r == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(r);
        return(r);
    }
    /* If n is greater than numE, extract the difference from the THEN child
    ** and retain the function represented by the ELSE branch.
    */
    if (numE < n) {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nv, (n-numE),max,index+1);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        r = cuddBddIteRecur(manager,v,q,Nnv);
        if (r == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(r);    
        return(r);
    }

    /* None of the above cases; (n < numT and n < numE) and either of
    ** the Nv, Nnv or both are not constants. If possible extract the
    ** required minterms the constant branch.
    */
    if (Cudd_IsConstant(Nv) && !Cudd_IsConstant(Nnv)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        result = cuddBddAndRecur(manager,v,q);
        if (result == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(result);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(result);
        return(result);
    } else if (!Cudd_IsConstant(Nv) && Cudd_IsConstant(Nnv)) {
        q = selectMintermsFromUniverse(manager,varSeen,n);
        if (q == NULL) {
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(q);
        result = cuddBddAndRecur(manager,Cudd_Not(v),q);
        if (result == NULL) {
            Cudd_RecursiveDeref(manager,q);
            Cudd_RecursiveDeref(manager,v);
            return(NULL);
        }
        cuddRef(result);
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        cuddDeref(result);
        return(result);
    }

    /* Both Nv and Nnv are not constants. So choose the one which
    ** has fewer minterms in its onset.
    */
    positive = 0;
    if (numT < numE) {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nv,n,max,index+1);
        positive = 1;
    } else {
        q = cuddSplitSetRecur(manager,mtable,varSeen,
                              Nnv,n,max,index+1);
    }

    if (q == NULL) {
        Cudd_RecursiveDeref(manager,v);
        return(NULL);
    }
    cuddRef(q);

    if (positive) {
        result = cuddBddAndRecur(manager,v,q);
    } else {
        result = cuddBddAndRecur(manager,Cudd_Not(v),q);
    }
    if (result == NULL) {
        Cudd_RecursiveDeref(manager,q);
        Cudd_RecursiveDeref(manager,v);
        return(NULL);
    }
    cuddRef(result);
    Cudd_RecursiveDeref(manager,q);
    Cudd_RecursiveDeref(manager,v);
    cuddDeref(result);

    return(result);

}